

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerSafe::CancelRequests(CommissionerSafe *this)

{
  anon_class_8_1_8991fb9c local_38;
  AsyncRequest local_30;
  CommissionerSafe *local_10;
  CommissionerSafe *this_local;
  
  local_38.this = this;
  local_10 = this;
  std::function<void()>::function<ot::commissioner::CommissionerSafe::CancelRequests()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  PushAsyncRequest(this,&local_30);
  std::function<void_()>::~function(&local_30);
  return;
}

Assistant:

void CommissionerSafe::CancelRequests()
{
    PushAsyncRequest([=]() { mImpl->CancelRequests(); });
}